

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O0

int dsListDel(dsList *list,void *data)

{
  int iVar1;
  uint64_t uVar2;
  void *local_48;
  dsListEntry *next;
  dsListEntry *prev;
  uint64_t listEntryOffset;
  uint64_t dataOffset;
  dsListEntry *entry;
  void *data_local;
  dsList *list_local;
  
  uVar2 = dsOffset(data);
  dataOffset = (uint64_t)dsListBegin(list);
  while( true ) {
    if (dataOffset == 0) {
      return 1;
    }
    if (*(uint64_t *)(dataOffset + 0x18) == uVar2) break;
    dataOffset = (uint64_t)dsListNext((dsListEntry *)dataOffset);
  }
  next = (dsListEntry *)0x0;
  local_48 = (void *)0x0;
  if ((*(long *)(dataOffset + 8) != -1) &&
     (next = (dsListEntry *)dsPtr(*(uint64_t *)(dataOffset + 8),0x20), next == (dsListEntry *)0x0))
  {
    dsRunLogCallback("%s(): Can\'t map list previous offset.\n","dsListDel");
    return -1;
  }
  if ((*(long *)(dataOffset + 0x10) != -1) &&
     (local_48 = dsPtr(*(uint64_t *)(dataOffset + 0x10),0x20), local_48 == (void *)0x0)) {
    dsRunLogCallback("%s(): Can\'t map list next offset.\n","dsListDel");
    return -1;
  }
  if (next != (dsListEntry *)0x0) {
    next->nextOffset = *(uint64_t *)(dataOffset + 0x10);
  }
  if (local_48 != (void *)0x0) {
    *(undefined8 *)((long)local_48 + 8) = *(undefined8 *)(dataOffset + 8);
  }
  uVar2 = dsOffset((void *)dataOffset);
  if (uVar2 == list->headOffset) {
    list->headOffset = *(uint64_t *)(dataOffset + 0x10);
  }
  list->count = list->count - 1;
  iVar1 = dsFree((void *)dataOffset);
  if (iVar1 < 0) {
    dsRunLogCallback("%s(): Can\'t free list entry object.\n","dsListDel");
    return -1;
  }
  return 0;
}

Assistant:

int
dsListDel(dsList *list, void *data)
{
	dsListEntry *entry;
	uint64_t dataOffset;
	uint64_t listEntryOffset;

	dataOffset = dsOffset(data);

	for (entry = dsListBegin(list);
		 entry != NULL;
		 entry = dsListNext(entry)) {

		if (entry->dataOffset == dataOffset) {
			dsListEntry *prev = NULL;
			dsListEntry *next = NULL;

			/*
			 * Found the entry to remove.
			 */
			if (entry->prevOffset != UINT64_MAX) {
				if ((prev = dsPtr(entry->prevOffset,
								sizeof(*entry))) == NULL) {
					dsLog("Can't map list previous offset.\n");
					return(-1);
				}
			}
			if (entry->nextOffset != UINT64_MAX) {
				if ((next = dsPtr(entry->nextOffset,
								sizeof(*entry))) == NULL) {
					dsLog("Can't map list next offset.\n");
					return(-1);
				}
			}

			/*
			 * Unlink after mapping all neighbors.
			 */
			if (prev != NULL) {
				prev->nextOffset = entry->nextOffset;
			}
			if (next != NULL) {
				next->prevOffset = entry->prevOffset;
			}

			listEntryOffset = dsOffset(entry);
			if (listEntryOffset == list->headOffset) {
				/*
				 * This was the first list entry.
				 */
				list->headOffset = entry->nextOffset;
			}

			list->count--;

			if (dsFree(entry) < 0) {
				dsLog("Can't free list entry object.\n");
				return(-1);
			}

			return(0);
		}
	}

	return(1);
}